

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsPath.cpp
# Opt level: O1

WindowsPath * __thiscall
WindowsPath::GetFolder(WindowsPath *__return_storage_ptr__,WindowsPath *this)

{
  StringList *this_00;
  
  (__return_storage_ptr__->mDriveLetter)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mDriveLetter).field_2;
  (__return_storage_ptr__->mDriveLetter)._M_string_length = 0;
  (__return_storage_ptr__->mDriveLetter).field_2._M_local_buf[0] = '\0';
  this_00 = &__return_storage_ptr__->mPathComponents;
  (__return_storage_ptr__->mPathComponents).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (__return_storage_ptr__->mPathComponents).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (__return_storage_ptr__->mPathComponents).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  if (__return_storage_ptr__ != this) {
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_dispatch<std::_List_const_iterator<std::__cxx11::string>>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (this->mPathComponents).
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next,&this->mPathComponents);
  }
  if ((__return_storage_ptr__->mPathComponents).
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(this_00,(__return_storage_ptr__->mPathComponents).
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_prev);
  }
  return __return_storage_ptr__;
}

Assistant:

WindowsPath WindowsPath::GetFolder() const
{
	WindowsPath newPath;
    
	// in edge case of drive letter only, will return the same path. in empty relative, will enter empty relative
	// in all other cases will return a path which is the same drive letter, and with one less component from the component list
    
	newPath.SetDriveLetter(mDriveLetter);
	newPath.mPathComponents = mPathComponents;
	newPath.PopPathComponent();
	return newPath;
}